

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_enc.c
# Opt level: O2

void VP8LBitsEntropyUnrefined(uint32_t *array,int n,VP8LBitEntropy *entropy)

{
  undefined4 uVar1;
  undefined4 uVar2;
  uint32_t uVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  float fVar7;
  double dVar8;
  
  entropy->entropy = 0.0;
  entropy->max_val = 0;
  entropy->nonzero_code = 0;
  entropy->max_val = 0;
  entropy->nonzero_code = 0xffffffff;
  uVar4 = 0;
  if (n < 1) {
    n = 0;
  }
  dVar8 = 0.0;
  for (uVar5 = 0; (uint)n != uVar5; uVar5 = uVar5 + 1) {
    uVar3 = array[uVar5];
    if (uVar3 != 0) {
      entropy->nonzero_code = (uint32_t)uVar5;
      uVar1 = entropy->sum;
      uVar2 = entropy->nonzeros;
      entropy->sum = uVar3 + uVar1;
      entropy->nonzeros = uVar2 + 1;
      uVar6 = array[uVar5];
      if ((ulong)uVar6 < 0x100) {
        fVar7 = kSLog2Table[uVar6];
      }
      else {
        fVar7 = (*VP8LFastSLog2Slow)(uVar6);
        dVar8 = entropy->entropy;
        uVar4 = entropy->max_val;
        uVar6 = array[uVar5];
      }
      dVar8 = dVar8 - (double)fVar7;
      entropy->entropy = dVar8;
      if (uVar4 < uVar6) {
        entropy->max_val = uVar6;
        uVar4 = uVar6;
      }
    }
  }
  uVar4 = entropy->sum;
  if ((ulong)uVar4 < 0x100) {
    fVar7 = kSLog2Table[uVar4];
  }
  else {
    fVar7 = (*VP8LFastSLog2Slow)(uVar4);
    dVar8 = entropy->entropy;
  }
  entropy->entropy = (double)fVar7 + dVar8;
  return;
}

Assistant:

void VP8LBitsEntropyUnrefined(const uint32_t* const array, int n,
                              VP8LBitEntropy* const entropy) {
  int i;

  VP8LBitEntropyInit(entropy);

  for (i = 0; i < n; ++i) {
    if (array[i] != 0) {
      entropy->sum += array[i];
      entropy->nonzero_code = i;
      ++entropy->nonzeros;
      entropy->entropy -= VP8LFastSLog2(array[i]);
      if (entropy->max_val < array[i]) {
        entropy->max_val = array[i];
      }
    }
  }
  entropy->entropy += VP8LFastSLog2(entropy->sum);
}